

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall CTPNObjProp::gen_setMethod(CTPNObjProp *this)

{
  tc_symtype_t tVar1;
  CTcSymPropBase *this_00;
  CTcCodeStream *pCVar2;
  void *__buf;
  void *__buf_00;
  long in_RDI;
  CTcSymProp *setm;
  uchar in_stack_000000cf;
  CTcGenTarg *in_stack_000000d0;
  textchar_t *in_stack_ffffffffffffffd8;
  CTcCodeStream *pCVar3;
  uint prop_id;
  CTcDataStream *in_stack_ffffffffffffffe0;
  
  CTcParser::get_global_symtab(G_prs);
  this_00 = (CTcSymPropBase *)
            CTcPrsSymtab::find((CTcPrsSymtab *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                               0x28c1d6);
  if ((this_00 != (CTcSymPropBase *)0x0) &&
     (tVar1 = CTcSymbolBase::get_type((CTcSymbolBase *)this_00), tVar1 == TC_SYM_PROP)) {
    CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
    pCVar2 = G_cs;
    pCVar3 = G_cs;
    CTcSymPropBase::get_prop(*(CTcSymPropBase **)(in_RDI + 0x28));
    prop_id = (uint)((ulong)pCVar3 >> 0x20);
    CTcDataStream::write_prop_id(in_stack_ffffffffffffffe0,prop_id);
    CTcGenTarg::note_push((CTcGenTarg *)0x28c25a);
    CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
    CTcDataStream::write(&G_cs->super_CTcDataStream,2,__buf,(size_t)pCVar2);
    CTcGenTarg::note_push((CTcGenTarg *)0x28c291);
    CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
    CTcDataStream::write(&G_cs->super_CTcDataStream,2,__buf_00,(size_t)pCVar2);
    pCVar2 = G_cs;
    CTcSymPropBase::get_prop(this_00);
    CTcDataStream::write_prop_id(&pCVar2->super_CTcDataStream,prop_id);
    CTcGenTarg::note_pop(G_cg,3);
    return;
  }
  CTcTokenizer::log_error(0x2cfc,9,"setMethod");
  return;
}

Assistant:

void CTPNObjProp::gen_setMethod()
{
    /* look up the setMethod property */
    CTcSymProp *setm = (CTcSymProp *)G_prs->get_global_symtab()->find(
        "setMethod", 9);
    if (setm == 0 || setm->get_type() != TC_SYM_PROP)
    {
        G_tok->log_error(TCERR_SYM_NOT_PROP, 9, "setMethod");
        return;
    }
    
    /* push the property ID */
    G_cg->write_op(OPC_PUSHPROPID);
    G_cs->write_prop_id(prop_sym_->get_prop());
    G_cg->note_push();

    /* re-push the object reference (it's on the stack above the value) */
    G_cg->write_op(OPC_GETSPN);
    G_cs->write(2);
    G_cg->note_push();

    /* generate <obj>.setMethod(<prop>, string) */
    G_cg->write_op(OPC_CALLPROP);
    G_cs->write(2);
    G_cs->write_prop_id(setm->get_prop());
    G_cg->note_pop(3);
}